

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O2

void __thiscall duckdb::LogManager::Initialize(LogManager *this)

{
  _Head_base<0UL,_duckdb::Logger_*,_false> _Var1;
  LoggingContext context;
  undefined7 uStack_3f;
  _Head_base<0UL,_duckdb::Logger_*,_false> local_18;
  
  context._1_7_ = uStack_3f;
  context.scope = 10;
  context.thread_id.index = 0xffffffffffffffff;
  context.connection_id.index = 0xffffffffffffffff;
  context.transaction_id.index = 0xffffffffffffffff;
  context.query_id.index = 0xffffffffffffffff;
  CreateLogger((LogManager *)&stack0xffffffffffffffe8,context,SUB81(this,0),false);
  _Var1._M_head_impl =
       (this->global_logger).super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>.
       _M_t.super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
       super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl;
  (this->global_logger).super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
  super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl = local_18._M_head_impl;
  if (_Var1._M_head_impl != (Logger *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_Logger + 8))();
    return;
  }
  return;
}

Assistant:

void LogManager::Initialize() {
	LoggingContext context(LogContextScope::DATABASE);
	global_logger = CreateLogger(context, true, true);
}